

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

uint64_t uv__read_cgroups_uint64(char *cgroup,char *param)

{
  int iVar1;
  uint64_t local_140;
  uint64_t rc;
  char buf [32];
  char filename [256];
  char *param_local;
  char *cgroup_local;
  
  local_140 = 0;
  snprintf(buf + 0x18,0x100,"/sys/fs/cgroup/%s/%s",cgroup,param);
  iVar1 = uv__slurp(buf + 0x18,(char *)&rc,0x20);
  if (iVar1 == 0) {
    __isoc99_sscanf(&rc,"%lu",&local_140);
  }
  return local_140;
}

Assistant:

static uint64_t uv__read_cgroups_uint64(const char* cgroup, const char* param) {
  char filename[256];
  char buf[32];  /* Large enough to hold an encoded uint64_t. */
  uint64_t rc;

  rc = 0;
  snprintf(filename, sizeof(filename), "/sys/fs/cgroup/%s/%s", cgroup, param);
  if (0 == uv__slurp(filename, buf, sizeof(buf)))
    sscanf(buf, "%" PRIu64, &rc);

  return rc;
}